

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wchar_t terminal_init(EditLine *el)

{
  funckey_t *arrow;
  char *pcVar1;
  funckey_t *pfVar2;
  char **ppcVar3;
  wchar_t *pwVar4;
  
  pcVar1 = (char *)calloc(0x800,1);
  (el->el_terminal).t_buf = pcVar1;
  if (pcVar1 != (char *)0x0) {
    pcVar1 = (char *)calloc(0x800,1);
    (el->el_terminal).t_cap = pcVar1;
    if (pcVar1 != (char *)0x0) {
      pfVar2 = (funckey_t *)calloc(7,0x20);
      (el->el_terminal).t_fkey = pfVar2;
      if (pfVar2 != (funckey_t *)0x0) {
        (el->el_terminal).t_loc = 0;
        ppcVar3 = (char **)calloc(0x27,8);
        (el->el_terminal).t_str = ppcVar3;
        if (ppcVar3 != (char **)0x0) {
          pwVar4 = (wchar_t *)calloc(8,4);
          (el->el_terminal).t_val = pwVar4;
          if (pwVar4 != (wchar_t *)0x0) {
            terminal_set(el,(char *)0x0);
            pfVar2 = (el->el_terminal).t_fkey;
            pfVar2->name = anon_var_dwarf_14747;
            pfVar2->key = L'\x10';
            (pfVar2->fun).cmd = '\x0f';
            pfVar2->type = L'\0';
            pfVar2[1].name = anon_var_dwarf_14753;
            pfVar2[1].key = L'\x13';
            pfVar2[1].fun.cmd = '\x12';
            pfVar2[1].type = L'\0';
            pfVar2[2].name = anon_var_dwarf_1475f;
            pfVar2[2].key = L'\x11';
            pfVar2[2].fun.cmd = '\x11';
            pfVar2[2].type = L'\0';
            pfVar2[3].name = anon_var_dwarf_1476b;
            pfVar2[3].key = L'\x12';
            pfVar2[3].fun.cmd = '\x0e';
            pfVar2[3].type = L'\0';
            pfVar2[4].name = anon_var_dwarf_14777;
            pfVar2[4].key = L'$';
            pfVar2[4].fun.cmd = '\v';
            pfVar2[4].type = L'\0';
            pfVar2[5].name = L"end";
            pfVar2[5].key = L'%';
            pfVar2[5].fun.cmd = '\f';
            pfVar2[5].type = L'\0';
            pfVar2[6].name = anon_var_dwarf_1479b;
            pfVar2[6].key = L'&';
            pfVar2[6].fun.cmd = '\x03';
            pfVar2[6].type = L'\0';
            return L'\0';
          }
        }
      }
    }
    terminal_end(el);
  }
  return L'\xffffffff';
}

Assistant:

libedit_private int
terminal_init(EditLine *el)
{

	el->el_terminal.t_buf = el_calloc(TC_BUFSIZE,
	    sizeof(*el->el_terminal.t_buf));
	if (el->el_terminal.t_buf == NULL)
		return -1;
	el->el_terminal.t_cap = el_calloc(TC_BUFSIZE,
	    sizeof(*el->el_terminal.t_cap));
	if (el->el_terminal.t_cap == NULL)
		goto out;
	el->el_terminal.t_fkey = el_calloc(A_K_NKEYS,
	    sizeof(*el->el_terminal.t_fkey));
	if (el->el_terminal.t_fkey == NULL)
		goto out;
	el->el_terminal.t_loc = 0;
	el->el_terminal.t_str = el_calloc(T_str,
	    sizeof(*el->el_terminal.t_str));
	if (el->el_terminal.t_str == NULL)
		goto out;
	el->el_terminal.t_val = el_calloc(T_val,
	    sizeof(*el->el_terminal.t_val));
	if (el->el_terminal.t_val == NULL)
		goto out;
	(void) terminal_set(el, NULL);
	terminal_init_arrow(el);
	return 0;
out:
	terminal_end(el);
	return -1;
}